

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# byte_stream_split_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::ByteStreamSplitDecoder::Read
          (ByteStreamSplitDecoder *this,uint8_t *defines,idx_t read_count,Vector *result,
          idx_t result_offset)

{
  type tVar1;
  ColumnReader *pCVar2;
  ResizeableBuffer *this_00;
  Allocator *allocator;
  idx_t iVar3;
  idx_t iVar4;
  pointer pBVar5;
  runtime_error *this_01;
  
  iVar4 = ColumnReader::GetValidCount(this->reader,defines,read_count,result_offset);
  pCVar2 = this->reader;
  this_00 = this->decoded_data_buffer;
  allocator = pCVar2->reader->allocator;
  iVar3 = this_00->alloc_len;
  (this_00->super_ByteBuffer).ptr = *(data_ptr_t *)&this_00->field_0x18;
  (this_00->super_ByteBuffer).len = iVar3;
  tVar1 = pCVar2->column_schema->parquet_type;
  if (tVar1 == DOUBLE) {
    ResizeableBuffer::resize(this_00,allocator,iVar4 << 3);
    pBVar5 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::
             operator->(&this->bss_decoder);
    BssDecoder::GetBatch<double>
              (pBVar5,(this->decoded_data_buffer->super_ByteBuffer).ptr,(uint32_t)iVar4);
  }
  else {
    if (tVar1 != FLOAT) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_01,"BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    ResizeableBuffer::resize(this_00,allocator,iVar4 << 2);
    pBVar5 = unique_ptr<duckdb::BssDecoder,_std::default_delete<duckdb::BssDecoder>,_true>::
             operator->(&this->bss_decoder);
    BssDecoder::GetBatch<float>
              (pBVar5,(this->decoded_data_buffer->super_ByteBuffer).ptr,(uint32_t)iVar4);
  }
  (*this->reader->_vptr_ColumnReader[0xe])
            (this->reader,this->decoded_data_buffer,defines,read_count,result_offset,result);
  return;
}

Assistant:

void ByteStreamSplitDecoder::Read(uint8_t *defines, idx_t read_count, Vector &result, idx_t result_offset) {
	idx_t valid_count = reader.GetValidCount(defines, read_count, result_offset);

	auto &allocator = reader.reader.allocator;
	decoded_data_buffer.reset();
	switch (reader.Schema().parquet_type) {
	case duckdb_parquet::Type::FLOAT:
		decoded_data_buffer.resize(allocator, sizeof(float) * valid_count);
		bss_decoder->GetBatch<float>(decoded_data_buffer.ptr, valid_count);
		break;
	case duckdb_parquet::Type::DOUBLE:
		decoded_data_buffer.resize(allocator, sizeof(double) * valid_count);
		bss_decoder->GetBatch<double>(decoded_data_buffer.ptr, valid_count);
		break;
	default:
		throw std::runtime_error("BYTE_STREAM_SPLIT encoding is only supported for FLOAT or DOUBLE data");
	}

	reader.Plain(decoded_data_buffer, defines, read_count, result_offset, result);
}